

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::EmptyStockPileTest_createPile_Test::TestBody
          (EmptyStockPileTest_createPile_Test *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  char *in_R9;
  AssertHelper local_90;
  Message local_88;
  _Optional_payload_base<unsigned_int> local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  EmptyStockPileTest_createPile_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_EmptyStockPileTest).pile);
  iVar2 = (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[6])();
  local_21 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                       ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                        CONCAT44(extraout_var,iVar2));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_20,
               (AssertionResult *)"pile->getCards().empty()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x1c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_EmptyStockPileTest).pile);
  local_80._M_payload._M_value = (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[7])();
  local_80._4_4_ = extraout_var_00;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_std::nullopt_t,_nullptr>
            ((EqHelper *)local_78,"pile->getSelectedCardIndex()","std::nullopt",
             (optional<unsigned_int> *)&local_80,(nullopt_t *)&std::nullopt);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x1d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  return;
}

Assistant:

TEST_F(EmptyStockPileTest, createPile) {
    EXPECT_TRUE(pile->getCards().empty());
    EXPECT_EQ(pile->getSelectedCardIndex(), std::nullopt);
}